

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPointCloudShape.cpp
# Opt level: O2

void __thiscall
cbtConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtConvexPointCloudShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,
          int numVectors)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar8;
  cbtScalar maxDot;
  cbtScalar local_44;
  cbtVector3 local_40;
  
  for (lVar4 = 0; auVar7 = in_ZMM0._8_56_,
      (ulong)(uint)(~(numVectors >> 0x1f) & numVectors) << 4 != lVar4; lVar4 = lVar4 + 0x10) {
    cVar8 = ::operator*((cbtVector3 *)((long)vectors->m_floats + lVar4),
                        (cbtVector3 *)
                        &(this->super_cbtPolyhedralConvexAabbCachingShape).
                         super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                         super_cbtConvexShape.super_cbtCollisionShape.field_0x1c);
    auVar5._0_8_ = cVar8.m_floats._0_8_;
    auVar5._8_56_ = auVar7;
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_8_ = cVar8.m_floats._8_8_;
    local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar1);
    in_ZMM0 = ZEXT1664((undefined1  [16])local_40.m_floats);
    lVar3 = cbtVector3::maxDot(&local_40,this->m_unscaledPoints,(long)this->m_numPoints,&local_44);
    auVar7 = in_ZMM0._8_56_;
    *(undefined4 *)((long)supportVerticesOut->m_floats + lVar4 + 0xc) = 0xdd5e0b6b;
    if (-1 < (int)lVar3) {
      cVar8 = getScaledPoint(this,(int)lVar3);
      auVar6._0_8_ = cVar8.m_floats._0_8_;
      auVar6._8_56_ = auVar7;
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = cVar8.m_floats._8_8_;
      auVar1 = vmovlhps_avx(auVar6._0_16_,auVar2);
      *(undefined1 (*) [16])((long)supportVerticesOut->m_floats + lVar4) = auVar1;
      in_ZMM0 = ZEXT464((uint)local_44);
      *(cbtScalar *)((long)supportVerticesOut->m_floats + lVar4 + 0xc) = local_44;
    }
  }
  return;
}

Assistant:

void cbtConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
{
	for (int j = 0; j < numVectors; j++)
	{
		const cbtVector3& vec = vectors[j] * m_localScaling;  // dot( a*c, b) = dot(a, b*c)
		cbtScalar maxDot;
		int index = (int)vec.maxDot(&m_unscaledPoints[0], m_numPoints, maxDot);
		supportVerticesOut[j][3] = cbtScalar(-BT_LARGE_FLOAT);
		if (0 <= index)
		{
			//WARNING: don't swap next lines, the w component would get overwritten!
			supportVerticesOut[j] = getScaledPoint(index);
			supportVerticesOut[j][3] = maxDot;
		}
	}
}